

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.cpp
# Opt level: O0

Image * rw::readPNG(char *filename)

{
  FILE *pFVar1;
  char *pcVar2;
  int32 depth;
  Error local_24c;
  Error _e_1;
  Error _e;
  uint32 error;
  uint32 h;
  uint32 w;
  uint8 *raw;
  LodePNGState state;
  uint8 *data;
  Image *pIStack_20;
  uint32 length;
  Image *image;
  char *filename_local;
  
  pIStack_20 = (Image *)0x0;
  image = (Image *)filename;
  state._496_8_ = getFileContents(filename,(uint32 *)((long)&data + 4));
  lodepng_state_init((LodePNGState *)&raw);
  _h = (uint8 *)0x0;
  state.decoder.ignore_critical = 0;
  _e.plugin = lodepng_decode((uchar **)&h,&error,&_e.code,(LodePNGState *)&raw,
                             (uchar *)state._496_8_,(ulong)data._4_4_);
  if (_e.plugin == 0) {
    if ((state.encoder._84_4_ == 4) && (state.encoder.text_compression == 3)) {
      pIStack_20 = Image::create(error,_e.code,4);
      Image::allocate(pIStack_20);
      memcpy(pIStack_20->palette,(void *)state.info_raw._0_8_,(long)state.info_raw.palette << 2);
      expandPal4_BE(pIStack_20->pixels,pIStack_20->stride,_h,error >> 1,error,_e.code);
    }
    else if (state.encoder._84_4_ == 8) {
      if (state.encoder.text_compression == 2) {
        pIStack_20 = Image::create(error,_e.code,0x18);
        Image::allocate(pIStack_20);
        memcpy(pIStack_20->pixels,_h,(ulong)(error * _e.code * 3));
      }
      else if (state.encoder.text_compression == 3) {
        depth = 8;
        if (state.info_raw.palette < (uchar *)0x11) {
          depth = 4;
        }
        pIStack_20 = Image::create(error,_e.code,depth);
        Image::allocate(pIStack_20);
        memcpy(pIStack_20->palette,(void *)state.info_raw._0_8_,(long)state.info_raw.palette << 2);
        memcpy(pIStack_20->pixels,_h,(ulong)(error * _e.code));
      }
      else {
        if (state.encoder.text_compression != 6) {
          free(_h);
          lodepng_state_init((LodePNGState *)&raw);
          _e.plugin = lodepng_decode((uchar **)&h,&error,&_e.code,(LodePNGState *)&raw,
                                     (uchar *)state._496_8_,(ulong)data._4_4_);
          if (_e.plugin != 0) {
            local_24c.plugin = 0;
            local_24c.code = 0x80000001;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/png.cpp"
                    ,0x41);
            pFVar1 = _stderr;
            pcVar2 = lodepng_error_text(_e.plugin);
            pcVar2 = dbgsprint(0x80000001,pcVar2);
            fprintf(pFVar1,"%s\n",pcVar2);
            setError(&local_24c);
            return (Image *)0x0;
          }
          _e.plugin = 0;
        }
        pIStack_20 = Image::create(error,_e.code,0x20);
        Image::allocate(pIStack_20);
        memcpy(pIStack_20->pixels,_h,(ulong)(error * _e.code * 4));
      }
    }
    free(_h);
    filename_local = (char *)pIStack_20;
  }
  else {
    _e_1.plugin = 0;
    _e_1.code = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/png.cpp",
            0x25);
    pFVar1 = _stderr;
    pcVar2 = lodepng_error_text(_e.plugin);
    pcVar2 = dbgsprint(0x80000001,pcVar2);
    fprintf(pFVar1,"%s\n",pcVar2);
    setError(&_e_1);
    filename_local = (char *)0x0;
  }
  return (Image *)filename_local;
}

Assistant:

Image*
readPNG(const char *filename)
{
	Image *image = nil;
	uint32 length;
	uint8 *data = getFileContents(filename, &length);
	assert(data != nil);

	LodePNGState state;
	lodepng_state_init(&state);
	uint8 *raw = nil;
	uint32 w, h;

	// First try: decode without conversion to see if we understand the format
	state.decoder.color_convert = 0;
	uint32 error = lodepng_decode(&raw, &w, &h, &state, data, length);
	if(error){
		RWERROR((ERR_GENERAL, lodepng_error_text(error)));
		return nil;
	}

	if(state.info_raw.bitdepth == 4 && state.info_raw.colortype == LCT_PALETTE){
		image = Image::create(w, h, 4);
		image->allocate();
		memcpy(image->palette, state.info_raw.palette, state.info_raw.palettesize*4);
		expandPal4_BE(image->pixels, image->stride, raw, w/2, w, h);
	}else if(state.info_raw.bitdepth == 8){
		switch(state.info_raw.colortype){
		case LCT_PALETTE:
			image = Image::create(w, h, state.info_raw.palettesize <= 16 ? 4 : 8);
			image->allocate();
			memcpy(image->palette, state.info_raw.palette, state.info_raw.palettesize*4);
			memcpy(image->pixels, raw, w*h);
			break;
		case LCT_RGB:
			image = Image::create(w, h, 24);
			image->allocate();
			memcpy(image->pixels, raw, w*h*3);
			break;
		default:
			// Second try: just load as 32 bit
			free(raw);
			lodepng_state_init(&state);
			error = lodepng_decode(&raw, &w, &h, &state, data, length);
			if(error){
				RWERROR((ERR_GENERAL, lodepng_error_text(error)));
				return nil;
			}
			// fall through
		case LCT_RGBA:
			image = Image::create(w, h, 32);
			image->allocate();
			memcpy(image->pixels, raw, w*h*4);
			break;
		}
	}

	free(raw);	// TODO: maybe override lodepng allocator

	return image;
}